

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_xdr.h
# Opt level: O0

void priv_from_native16(void *ptr,int n)

{
  int n_local;
  void *ptr_local;
  
  return;
}

Assistant:

static inline void
priv_from_native16 (void* ptr, int n)
{
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
    uint16_t* vals = (uint16_t*) ptr;
    for (int i = 0; i < n; ++i)
        vals[i] = htole16 (vals[i]);
#else
    (void) ptr;
    (void) n;
#endif
}